

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void google::protobuf::MethodDescriptorProto::SharedDtor(MessageLite *self)

{
  MethodOptions *this;
  ulong uVar1;
  LogMessageFatal LStack_18;
  
  internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>(&self->_internal_metadata_);
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&self[1]._internal_metadata_);
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 2));
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&self[2]._internal_metadata_);
    this = (MethodOptions *)self[3]._vptr_MessageLite;
    if (this != (MethodOptions *)0x0) {
      MethodOptions::~MethodOptions(this);
    }
    operator_delete(this,0x58);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
             ,0x1dd9,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
}

Assistant:

inline void MethodDescriptorProto::SharedDtor(MessageLite& self) {
  MethodDescriptorProto& this_ = static_cast<MethodDescriptorProto&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.name_.Destroy();
  this_._impl_.input_type_.Destroy();
  this_._impl_.output_type_.Destroy();
  delete this_._impl_.options_;
  this_._impl_.~Impl_();
}